

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CumSumLayerParams::MergeFrom(CumSumLayerParams *this,CumSumLayerParams *from)

{
  bool bVar1;
  LogMessage *other;
  int64_t iVar2;
  LogFinisher local_65;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  CumSumLayerParams *local_18;
  CumSumLayerParams *from_local;
  CumSumLayerParams *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xe428);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar2 = _internal_axis(local_18);
  if (iVar2 != 0) {
    iVar2 = _internal_axis(local_18);
    _internal_set_axis(this,iVar2);
  }
  bVar1 = _internal_excludefinalsum(local_18);
  if (bVar1) {
    bVar1 = _internal_excludefinalsum(local_18);
    _internal_set_excludefinalsum(this,bVar1);
  }
  bVar1 = _internal_reverse(local_18);
  if (bVar1) {
    bVar1 = _internal_reverse(local_18);
    _internal_set_reverse(this,bVar1);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void CumSumLayerParams::MergeFrom(const CumSumLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.CumSumLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_axis() != 0) {
    _internal_set_axis(from._internal_axis());
  }
  if (from._internal_excludefinalsum() != 0) {
    _internal_set_excludefinalsum(from._internal_excludefinalsum());
  }
  if (from._internal_reverse() != 0) {
    _internal_set_reverse(from._internal_reverse());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}